

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

int bid_keyword_list(char *p,ssize_t len,int unset,int last_is_path)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char cVar8;
  byte bVar9;
  undefined8 *puVar10;
  
  if (len < 1) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    while (cVar8 = *p, cVar8 != '\0') {
      bVar9 = 0;
      pcVar7 = p;
      while( true ) {
        pcVar6 = pcVar7 + 1;
        if ((cVar8 != ' ') && (cVar8 != '\t')) goto LAB_00465151;
        pcVar7 = pcVar6;
        if (len < 2) break;
        len = len + -1;
        cVar8 = *pcVar6;
        bVar9 = 1;
      }
      cVar8 = *pcVar6;
      bVar9 = 1;
      len = 0;
LAB_00465151:
      cVar1 = cVar8;
      if (cVar8 == '\\') {
        cVar1 = pcVar7[1];
      }
      if (cVar1 == '\n') {
        return iVar5;
      }
      if (cVar1 == '\r') {
        return iVar5;
      }
      if ((bool)(last_is_path == 0 & (bVar9 ^ 1))) {
        return -1;
      }
      if ((last_is_path != 0) && (len == 0)) {
        return iVar5;
      }
      if ((unset != 0) && (iVar2 = bid_keycmp(pcVar7,"all",len), 0 < iVar2)) {
        return 1;
      }
      bVar9 = cVar8 + 0x9d;
      if (0x12 < bVar9) {
        return -1;
      }
      if ((0x79e5bU >> (bVar9 & 0x1f) & 1) == 0) {
        return -1;
      }
      puVar10 = (undefined8 *)(&PTR_bid_keyword_keys_c_00616778)[bVar9];
      pcVar6 = (char *)*puVar10;
      while( true ) {
        if (pcVar6 == (char *)0x0) {
          return -1;
        }
        puVar10 = puVar10 + 1;
        uVar3 = bid_keycmp(pcVar7,pcVar6,len);
        if (0 < (int)uVar3) break;
        pcVar6 = (char *)*puVar10;
      }
      uVar4 = (ulong)uVar3;
      p = pcVar7 + uVar4;
      len = len - uVar4;
      iVar5 = iVar5 + 1;
      if (pcVar7[uVar4] == '=') {
        p = p + 1;
        if (len < 2) {
          bVar9 = 0;
        }
        else {
          bVar9 = 0;
          while ((*p != ' ' && (*p != '\t'))) {
            p = p + 1;
            len = len + -1;
            bVar9 = 1;
            if (len < 2) {
              return iVar5;
            }
          }
        }
        len = len + -1;
        if ((bool)(unset == 0 & (bVar9 ^ 1))) {
          return -1;
        }
      }
      if (len < 1) {
        return iVar5;
      }
    }
  }
  return iVar5;
}

Assistant:

static int
bid_keyword_list(const char *p,  ssize_t len, int unset, int last_is_path)
{
	int l;
	int keycnt = 0;

	while (len > 0 && *p) {
		int blank = 0;

		/* Test whether there are blank characters in the line. */
		while (len >0 && (*p == ' ' || *p == '\t')) {
			++p;
			--len;
			blank = 1;
		}
		if (*p == '\n' || *p == '\r')
			break;
		if (p[0] == '\\' && (p[1] == '\n' || p[1] == '\r'))
			break;
		if (!blank && !last_is_path) /* No blank character. */
			return (-1);
		if (last_is_path && len == 0)
				return (keycnt);

		if (unset) {
			l = bid_keycmp(p, "all", len);
			if (l > 0)
				return (1);
		}
		/* Test whether there is a correct key in the line. */
		l = bid_keyword(p, len);
		if (l == 0)
			return (-1);/* Unknown keyword was found. */
		p += l;
		len -= l;
		keycnt++;

		/* Skip value */
		if (*p == '=') {
			int value = 0;
			++p;
			--len;
			while (len > 0 && *p != ' ' && *p != '\t') {
				++p;
				--len;
				value = 1;
			}
			/* A keyword should have a its value unless
			 * "/unset" operation. */ 
			if (!unset && value == 0)
				return (-1);
		}
	}
	return (keycnt);
}